

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O3

NumCells *
amrex::anon_unknown_27::countCells
          (NumCells *__return_storage_ptr__,Array4<const_amrex::EBCellFlag> *flag,Box *bx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  EBCellFlag *pEVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  NumCells *pNVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint *puVar20;
  FabType FVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  bool bVar25;
  uint local_84;
  uint local_80;
  uint local_7c [10];
  int nmulti;
  int nsingle;
  int nregular;
  
  local_7c[0] = 0;
  local_80 = 0;
  local_84 = 0;
  iVar11 = (bx->bigend).vect[0];
  iVar19 = (bx->smallend).vect[0];
  iVar1 = (bx->smallend).vect[1];
  iVar22 = (iVar11 - iVar19) + 1;
  iVar2 = (bx->bigend).vect[1];
  iVar3 = (bx->bigend).vect[2];
  iVar4 = (bx->smallend).vect[2];
  uVar23 = ((iVar3 - iVar4) + 1) * ((iVar2 - iVar1) + 1) * iVar22;
  pNVar12 = (NumCells *)0x0;
  uVar16 = 0;
  uVar14 = 0;
  if (iVar4 <= iVar3) {
    pEVar7 = flag->p;
    lVar8 = flag->jstride;
    lVar9 = flag->kstride;
    iVar5 = (flag->begin).y;
    iVar6 = (flag->begin).z;
    iVar10 = iVar19 - (flag->begin).x;
    do {
      if (iVar1 <= iVar2) {
        lVar13 = ((long)iVar4 - (long)iVar6) * lVar9;
        iVar18 = iVar1;
        do {
          if (iVar19 <= iVar11) {
            lVar17 = ((long)iVar18 - (long)iVar5) * lVar8;
            puVar20 = local_7c;
            iVar24 = iVar22;
            iVar15 = iVar10;
            switch(pEVar7[lVar13 + lVar17 + iVar10].flag & 3) {
            case 1:
              goto switchD_004ed868_caseD_1;
            case 2:
              goto switchD_004ed868_caseD_2;
            case 3:
              goto switchD_004ed868_caseD_3;
            }
switchD_004ed868_caseD_0:
            *puVar20 = *puVar20 + 1;
switchD_004ed868_caseD_3:
            do {
              iVar24 = iVar24 + -1;
              if (iVar24 == 0) break;
              iVar15 = iVar15 + 1;
              puVar20 = local_7c;
              switch(pEVar7[lVar13 + lVar17 + iVar15].flag & 3) {
              case 0:
                goto switchD_004ed868_caseD_0;
              case 1:
                goto switchD_004ed868_caseD_1;
              case 2:
                goto switchD_004ed868_caseD_2;
              }
            } while( true );
          }
          bVar25 = iVar18 != iVar2;
          iVar18 = iVar18 + 1;
        } while (bVar25);
      }
      bVar25 = iVar4 != iVar3;
      iVar4 = iVar4 + 1;
    } while (bVar25);
    pNVar12 = (NumCells *)(ulong)local_84;
    uVar16 = local_7c[0];
    uVar14 = local_80;
  }
  FVar21 = regular;
  iVar11 = (int)pNVar12;
  iVar19 = uVar14 + uVar16 + iVar11;
  if (uVar16 != uVar23) {
    if (iVar19 == 0) {
      FVar21 = covered;
    }
    else {
      FVar21 = (uint)(0 < iVar11) + singlevalued;
    }
  }
  __return_storage_ptr__->type = FVar21;
  __return_storage_ptr__->nregular = uVar16;
  __return_storage_ptr__->nsingle = uVar14;
  __return_storage_ptr__->nmulti = iVar11;
  __return_storage_ptr__->ncovered = uVar23 - iVar19;
  return pNVar12;
switchD_004ed868_caseD_2:
  puVar20 = &local_84;
  goto switchD_004ed868_caseD_0;
switchD_004ed868_caseD_1:
  puVar20 = &local_80;
  goto switchD_004ed868_caseD_0;
}

Assistant:

EBCellFlagFab::NumCells countCells (Array4<EBCellFlag const> const& flag, const Box& bx) noexcept
{
    int nregular=0, nsingle=0, nmulti=0;
    int ncells = static_cast<int>(bx.numPts());
    AMREX_ASSERT(bx.numPts() <= static_cast<Long>(std::numeric_limits<int>::max()));

    if (Gpu::inLaunchRegion())
    {
        ReduceOps<ReduceOpSum,ReduceOpSum,ReduceOpSum> reduce_op;
        ReduceData<int,int,int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(bx, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            int nr=0, ns=0, nm=0;
            auto f = flag(i,j,k);
            if (f.isRegular()) {
                ++nr;
            } else if (f.isSingleValued()) {
                ++ns;
            } else if (f.isMultiValued()) {
                ++nm;
            }
            return {nr, ns, nm};
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        nregular = amrex::get<0>(hv);
        nsingle  = amrex::get<1>(hv);
        nmulti   = amrex::get<2>(hv);
    }
    else
    {
        amrex::LoopOnCpu(bx,
        [=,&nregular,&nsingle,&nmulti] (int i, int j, int k) noexcept
        {
            auto f = flag(i,j,k);
            if (f.isRegular()) {
                ++nregular;
            } else if (f.isSingleValued()) {
                ++nsingle;
            } else if (f.isMultiValued()) {
                ++nmulti;
            }
        });
    }

    int ncovered = ncells - nregular - nsingle - nmulti;

    EBCellFlagFab::NumCells r;
    if (nregular == ncells) {
        r.type = FabType::regular;
    } else if (ncovered == ncells) {
        r.type = FabType::covered;
    } else if (nmulti > 0) {
        r.type = FabType::multivalued;
    } else {
        r.type = FabType::singlevalued;
    }
    r.nregular = nregular;
    r.nsingle = nsingle;
    r.nmulti = nmulti;
    r.ncovered = ncovered;
    return r;
}